

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  cmGeneratedFileStream *pcVar1;
  cmGeneratorTarget *this_01;
  pointer ppcVar2;
  pointer ppcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Encoding EVar7;
  ostream *poVar8;
  cmCustomCommand *this_02;
  string *psVar9;
  cmGeneratedFileStream *this_03;
  pointer ppcVar10;
  char *pcVar11;
  long lVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  string compilerDependTimestamp;
  string compilerDependFile;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  string depsUseCompiler;
  string dependFileNameFull;
  cmGeneratedFileStream depFileStream;
  cmGeneratedFileStream timestampFileStream;
  string local_598;
  string local_578;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_558;
  string local_540;
  string local_520;
  undefined1 local_500 [16];
  undefined1 local_4f0 [600];
  undefined1 local_298 [16];
  undefined1 local_288 [600];
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_500._0_8_ = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_500,"CMAKE_MAKE_INCLUDE_FROM_ROOT","");
  bVar4 = cmMakefile::IsOn(this_00,(string *)local_500);
  pcVar11 = "";
  if (bVar4) {
    pcVar11 = "$(CMAKE_BINARY_DIR)/";
  }
  if ((undefined1 *)local_500._0_8_ != local_4f0) {
    operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
  }
  local_500._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_500._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_4f0._0_8_ = 0xc;
  local_4f0._8_8_ = "/depend.make";
  views._M_len = 2;
  views._M_array = (iterator)local_500;
  cmCatViews_abi_cxx11_(&local_520,views);
  pcVar1 = (this->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar1,"# Include any dependencies generated for this target.\n",0x36);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar1,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p,
                      (this->GlobalGenerator->IncludeDirective)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  lVar12 = 0x14;
  if (!bVar4) {
    lVar12 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,lVar12);
  cmOutputConverter::MaybeRelativeToTopBinDir
            ((string *)local_298,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,&local_520);
  cmSystemTools::ConvertToOutputPath((string *)local_500,(string *)local_298);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_500._0_8_,local_500._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
  if ((undefined1 *)local_500._0_8_ != local_4f0) {
    operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
  }
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  local_558.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_558.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_500,this);
  cmGeneratorTarget::GetCustomCommands(this_01,&local_558,(string *)local_500);
  if ((undefined1 *)local_500._0_8_ != local_4f0) {
    operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
  }
  ppcVar3 = local_558.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppcVar2 = local_558.
            super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_558.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_558.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = true;
  }
  else {
    do {
      ppcVar10 = ppcVar2 + 1;
      this_02 = cmSourceFile::GetCustomCommand(*ppcVar2);
      psVar9 = cmCustomCommand::GetDepfile_abi_cxx11_(this_02);
      bVar4 = psVar9->_M_string_length == 0;
      if (!bVar4) break;
      ppcVar2 = ppcVar10;
    } while (ppcVar10 != ppcVar3);
  }
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_540,"CMAKE_DEPENDS_USE_COMPILER","");
  if (this->GlobalGenerator->ToolSupportsCompilerDependencies == true) {
    bVar5 = cmMakefile::IsDefinitionSet((this->super_cmCommonTargetGenerator).Makefile,&local_540);
    bVar6 = true;
    if ((bVar5) &&
       (bVar6 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&local_540),
       bVar4 && !bVar6)) goto LAB_0050a7e3;
LAB_0050a3ab:
    local_500._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    local_500._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
    local_4f0._0_8_ = 0x15;
    local_4f0._8_8_ = "/compiler_depend.make";
    views_00._M_len = 2;
    views_00._M_array = (iterator)local_500;
    cmCatViews_abi_cxx11_(&local_578,views_00);
    pcVar1 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar1,
               "# Include any dependencies generated by the compiler for this target.\n",0x46);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar1,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p
                        ,(this->GlobalGenerator->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,lVar12);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)local_298,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_578);
    cmSystemTools::ConvertToOutputPath((string *)local_500,(string *)local_298);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_500._0_8_,local_500._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
    if ((undefined1 *)local_500._0_8_ != local_4f0) {
      operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
    EVar7 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_500,&local_578,false,EVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_500,"# Empty compiler generated dependencies file for ",0x31);
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_500,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"# This may be replaced when dependencies are built.\n",0x34);
    local_298._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    local_298._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
    local_288._0_8_ = 0x19;
    local_288._8_8_ = "/compiler_depend.internal";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_298;
    cmCatViews_abi_cxx11_(&local_598,views_01);
    cmsys::SystemTools::RemoveFile(&local_598);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    local_298._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    local_298._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
    local_288._0_8_ = 0x13;
    local_288._8_8_ = "/compiler_depend.ts";
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_298;
    cmCatViews_abi_cxx11_(&local_598,views_02);
    bVar4 = cmsys::SystemTools::FileExists(&local_598);
    if (!bVar4) {
      EVar7 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_298,&local_598,false,EVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,"# CMAKE generated file: DO NOT EDIT!\n",0x25);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_298,
                 "# Timestamp file for compiler generated dependencies management for ",0x44);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_298,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_598._M_dataplus._M_p != &local_598.field_2) {
      operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    if (bVar6 == false) goto LAB_0050a7e3;
    EVar7 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_500,&local_520,false,EVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_500,"# Empty dependencies file for ",0x1e);
    psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_500,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"# This may be replaced when dependencies are built.\n",0x34);
    local_298._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
    local_298._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
    local_288._0_8_ = 0x10;
    local_288._8_8_ = "/depend.internal";
    views_03._M_len = 2;
    views_03._M_array = (iterator)local_298;
    cmCatViews_abi_cxx11_(&local_578,views_03);
    cmsys::SystemTools::RemoveFile(&local_578);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
LAB_0050a879:
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
  }
  else {
    if (!bVar4) {
      bVar6 = false;
      goto LAB_0050a3ab;
    }
LAB_0050a7e3:
    bVar4 = cmsys::SystemTools::FileExists(&local_520);
    if (!bVar4) {
      EVar7 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_500,&local_520,false,EVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_500,"# Empty dependencies file for ",0x1e);
      psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                         ((this->super_cmCommonTargetGenerator).GeneratorTarget);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_500,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,".\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"# This may be replaced when dependencies are built.\n",0x34);
      goto LAB_0050a879;
    }
  }
  if (this->NoRuleMessages == false) {
    pcVar1 = (this->BuildFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pcVar1,"# Include the progress variables for this target.\n",0x32);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)pcVar1,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p
                        ,(this->GlobalGenerator->IncludeDirective)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,lVar12);
    cmOutputConverter::MaybeRelativeToTopBinDir
              ((string *)local_298,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&this->ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath((string *)local_500,(string *)local_298);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_500._0_8_,local_500._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
    if ((undefined1 *)local_500._0_8_ != local_4f0) {
      operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
    }
    if ((undefined1 *)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
    }
  }
  local_500._8_8_ = (this->TargetBuildDirectoryFull)._M_dataplus._M_p;
  local_500._0_8_ = (this->TargetBuildDirectoryFull)._M_string_length;
  local_4f0._0_8_ = 0xb;
  local_4f0._8_8_ = "/flags.make";
  views_04._M_len = 2;
  views_04._M_array = (iterator)local_500;
  cmCatViews_abi_cxx11_((string *)local_298,views_04);
  psVar9 = &this->FlagFileNameFull;
  std::__cxx11::string::operator=((string *)psVar9,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
  EVar7 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[5])();
  this_03 = (cmGeneratedFileStream *)operator_new(0x268);
  cmGeneratedFileStream::cmGeneratedFileStream(this_03,psVar9,false,EVar7);
  pcVar1 = (this->FlagFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  (this->FlagFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = this_03;
  if (pcVar1 != (cmGeneratedFileStream *)0x0) {
    (**(code **)(*(long *)&(pcVar1->super_ofstream).
                           super_basic_ostream<char,_std::char_traits<char>_> + 8))();
    this_03 = (this->FlagFileStream)._M_t.
              super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
              .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    if (this_03 == (cmGeneratedFileStream *)0x0) goto LAB_0050ab85;
  }
  cmGeneratedFileStream::SetCopyIfDifferent(this_03,true);
  cmLocalUnixMakefileGenerator3::WriteDisclaimer
            (this->LocalGenerator,
             (ostream *)
             (this->FlagFileStream)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
  pcVar1 = (this->BuildFileStream)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pcVar1,"# Include the compile flags for this target\'s objects.\n",0x37);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)pcVar1,(this->GlobalGenerator->IncludeDirective)._M_dataplus._M_p,
                      (this->GlobalGenerator->IncludeDirective)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,lVar12);
  cmOutputConverter::MaybeRelativeToTopBinDir
            ((string *)local_298,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,psVar9);
  cmSystemTools::ConvertToOutputPath((string *)local_500,(string *)local_298);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_500._0_8_,local_500._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n\n",2);
  if ((undefined1 *)local_500._0_8_ != local_4f0) {
    operator_delete((void *)local_500._0_8_,local_4f0._0_8_ + 1);
  }
  if ((undefined1 *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288._0_8_ + 1);
  }
LAB_0050ab85:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if (local_558.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_558.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.
                          super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/depend.make");
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(dependFileNameFull))
    << "\n";

  // Scan any custom commands to check if DEPFILE option is specified
  bool ccGenerateDeps = false;
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands,
                                           this->GetConfigName());
  for (cmSourceFile const* sf : customCommands) {
    if (!sf->GetCustomCommand()->GetDepfile().empty()) {
      ccGenerateDeps = true;
      break;
    }
  }

  std::string depsUseCompiler = "CMAKE_DEPENDS_USE_COMPILER";
  bool compilerGenerateDeps =
    this->GlobalGenerator->SupportsCompilerDependencies() &&
    (!this->Makefile->IsDefinitionSet(depsUseCompiler) ||
     this->Makefile->IsOn(depsUseCompiler));

  if (compilerGenerateDeps || ccGenerateDeps) {
    std::string compilerDependFile =
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.make");
    *this->BuildFileStream << "# Include any dependencies generated by the "
                              "compiler for this target.\n"
                           << this->GlobalGenerator->IncludeDirective << " "
                           << root
                           << cmSystemTools::ConvertToOutputPath(
                                this->LocalGenerator->MaybeRelativeToTopBinDir(
                                  compilerDependFile))
                           << "\n\n";

    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      compilerDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty compiler generated dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built.\n";
    // remove internal dependency file
    cmSystemTools::RemoveFile(
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.internal"));

    std::string compilerDependTimestamp =
      cmStrCat(this->TargetBuildDirectoryFull, "/compiler_depend.ts");
    if (!cmSystemTools::FileExists(compilerDependTimestamp)) {
      // Write a dependency timestamp file.
      cmGeneratedFileStream timestampFileStream(
        compilerDependTimestamp, false,
        this->GlobalGenerator->GetMakefileEncoding());
      timestampFileStream
        << "# CMAKE generated file: DO NOT EDIT!\n"
        << "# Timestamp file for compiler generated dependencies "
           "management for "
        << this->GeneratorTarget->GetName() << ".\n";
    }
  }

  if (compilerGenerateDeps) {
    // deactivate no longer needed legacy dependency files
    // Write an empty dependency file.
    cmGeneratedFileStream legacyDepFileStream(
      dependFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
    legacyDepFileStream
      << "# Empty dependencies file for " << this->GeneratorTarget->GetName()
      << ".\n"
      << "# This may be replaced when dependencies are built.\n";
    // remove internal dependency file
    cmSystemTools::RemoveFile(
      cmStrCat(this->TargetBuildDirectoryFull, "/depend.internal"));
  } else {
    // make sure the depend file exists
    if (!cmSystemTools::FileExists(dependFileNameFull)) {
      // Write an empty dependency file.
      cmGeneratedFileStream depFileStream(
        dependFileNameFull, false,
        this->GlobalGenerator->GetMakefileEncoding());
      depFileStream << "# Empty dependencies file for "
                    << this->GeneratorTarget->GetName() << ".\n"
                    << "# This may be replaced when dependencies are built.\n";
    }
  }

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator->MaybeRelativeToTopBinDir(
             this->ProgressFileNameFull))
      << "\n\n";
  }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull =
    cmStrCat(this->TargetBuildDirectoryFull, "/flags.make");
  this->FlagFileStream = cm::make_unique<cmGeneratedFileStream>(
    this->FlagFileNameFull, false,
    this->GlobalGenerator->GetMakefileEncoding());
  if (!this->FlagFileStream) {
    return;
  }
  this->FlagFileStream->SetCopyIfDifferent(true);
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator->MaybeRelativeToTopBinDir(
           this->FlagFileNameFull))
    << "\n\n";
}